

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureCases.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Performance::Texture2DRenderCase::init(Texture2DRenderCase *this,EVP_PKEY_CTX *ctx)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Mat3 *mtx;
  float *pfVar5;
  MessageBuilder *pMVar6;
  ostream *poVar7;
  Texture2D *this_00;
  Texture2D *pTVar8;
  PixelBufferAccess *access;
  int *piVar9;
  char *pcVar10;
  EVP_PKEY_CTX *ctx_00;
  Enum<int,_2UL> EVar11;
  int local_1110;
  bool local_e79;
  Vector<float,_4> local_e70;
  Vector<float,_4> local_e60;
  Vector<float,_4> local_e50;
  Vector<float,_4> local_e40;
  int local_e30;
  int local_e2c;
  int levelNdx;
  int numLevels;
  Texture2D *texture;
  IVec4 *sw;
  string local_e10 [4];
  int texNdx_2;
  int local_df0;
  int local_dec;
  int texNdx_1;
  int texNdx;
  ostringstream fragSrc;
  char *local_af0;
  MessageBuilder local_ae8;
  GetNameFunc local_968;
  int local_960;
  Enum<int,_2UL> local_958;
  GetNameFunc local_948;
  int local_940;
  Enum<int,_2UL> local_938;
  MessageBuilder local_928;
  GetNameFunc local_7a8;
  int local_7a0;
  Enum<int,_2UL> local_798;
  GetNameFunc local_788;
  int local_780;
  Enum<int,_2UL> local_778;
  MessageBuilder local_768;
  MessageBuilder local_5e8;
  char *local_468;
  char *local_460;
  MessageBuilder local_458;
  MessageBuilder local_2d8;
  Vector<float,_4> local_148;
  Vector<float,_4> local_138;
  Vector<float,_4> local_128;
  Vector<float,_4> local_118;
  AttribSpec local_108;
  Vector<float,_3> local_a4;
  tcu local_98 [12];
  undefined1 local_8c [8];
  Vec2 p11;
  tcu local_78 [12];
  undefined1 local_6c [8];
  Vec2 p01;
  tcu local_58 [12];
  undefined1 local_4c [8];
  Vec2 p10;
  tcu local_38 [12];
  undefined1 local_2c [8];
  Vec2 p00;
  int iStack_1c;
  bool mipmaps;
  int height;
  int width;
  TestLog *log;
  Texture2DRenderCase *this_local;
  
  log = (TestLog *)this;
  _height = tcu::TestContext::getLog
                      ((this->super_ShaderPerformanceCase).super_TestCase.super_TestNode.m_testCtx);
  iVar4 = (*((this->super_ShaderPerformanceCase).m_renderCtx)->_vptr_RenderContext[4])();
  iStack_1c = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar4));
  iVar4 = (*((this->super_ShaderPerformanceCase).m_renderCtx)->_vptr_RenderContext[4])();
  p00.m_data[1] =
       (float)tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar4));
  if ((this->m_powerOfTwo & 1U) != 0) {
    iStack_1c = roundDownToPowerOfTwo(iStack_1c);
    p00.m_data[1] = (float)roundDownToPowerOfTwo((int)p00.m_data[1]);
  }
  local_e79 = true;
  if (((this->m_minFilter != 0x2700) && (local_e79 = true, this->m_minFilter != 0x2702)) &&
     (local_e79 = true, this->m_minFilter != 0x2701)) {
    local_e79 = this->m_minFilter == 0x2703;
  }
  p00.m_data[0]._3_1_ = local_e79;
  mtx = &this->m_coordTransform;
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&p10,0.0,0.0,1.0);
  tcu::operator*(local_38,mtx,(Vector<float,_3> *)&p10);
  tcu::Vector<float,_3>::swizzle((Vector<float,_3> *)local_2c,(int)local_38,0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&p01,1.0,0.0,1.0);
  tcu::operator*(local_58,mtx,(Vector<float,_3> *)&p01);
  tcu::Vector<float,_3>::swizzle((Vector<float,_3> *)local_4c,(int)local_58,0);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&p11,0.0,1.0,1.0);
  tcu::operator*(local_78,mtx,(Vector<float,_3> *)&p11);
  tcu::Vector<float,_3>::swizzle((Vector<float,_3> *)local_6c,(int)local_78,0);
  tcu::Vector<float,_3>::Vector(&local_a4,1.0,1.0,1.0);
  tcu::operator*(local_98,mtx,&local_a4);
  tcu::Vector<float,_3>::swizzle((Vector<float,_3> *)local_8c,(int)local_98,0);
  pfVar5 = tcu::Vector<float,_2>::x((Vector<float,_2> *)local_2c);
  fVar1 = *pfVar5;
  pfVar5 = tcu::Vector<float,_2>::y((Vector<float,_2> *)local_2c);
  tcu::Vector<float,_4>::Vector(&local_118,fVar1,*pfVar5,0.0,0.0);
  pfVar5 = tcu::Vector<float,_2>::x((Vector<float,_2> *)local_4c);
  fVar1 = *pfVar5;
  pfVar5 = tcu::Vector<float,_2>::y((Vector<float,_2> *)local_4c);
  tcu::Vector<float,_4>::Vector(&local_128,fVar1,*pfVar5,0.0,0.0);
  pfVar5 = tcu::Vector<float,_2>::x((Vector<float,_2> *)local_6c);
  fVar1 = *pfVar5;
  pfVar5 = tcu::Vector<float,_2>::y((Vector<float,_2> *)local_6c);
  tcu::Vector<float,_4>::Vector(&local_138,fVar1,*pfVar5,0.0,0.0);
  pfVar5 = tcu::Vector<float,_2>::x((Vector<float,_2> *)local_8c);
  fVar1 = *pfVar5;
  pfVar5 = tcu::Vector<float,_2>::y((Vector<float,_2> *)local_8c);
  tcu::Vector<float,_4>::Vector(&local_148,fVar1,*pfVar5,0.0,0.0);
  deqp::gls::AttribSpec::AttribSpec
            (&local_108,"a_coords",&local_118,&local_128,&local_138,&local_148);
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::push_back
            (&(this->super_ShaderPerformanceCase).m_attributes,&local_108);
  deqp::gls::AttribSpec::~AttribSpec(&local_108);
  tcu::TestLog::operator<<(&local_2d8,_height,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_2d8,(char (*) [7])0x2c60e44);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&stack0xffffffffffffffe4);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2a8224a);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)(p00.m_data + 1));
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2d8);
  tcu::TestLog::operator<<(&local_458,_height,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_458,(char (*) [9])0x29a5d4e);
  local_460 = glu::getTextureFormatName(this->m_format);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_460);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c6cdd6);
  local_468 = glu::getTypeName(this->m_dataType);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_468);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_458);
  tcu::TestLog::operator<<(&local_5e8,_height,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_5e8,(char (*) [9])"Coords: ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(Vector<float,_2> *)local_2c);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(Vector<float,_2> *)local_4c);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(Vector<float,_2> *)local_6c);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(Vector<float,_2> *)local_8c);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_5e8);
  tcu::TestLog::operator<<(&local_768,_height,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_768,(char (*) [7])"Wrap: ");
  EVar11 = glu::getTextureWrapModeStr(this->m_wrapS);
  local_788 = EVar11.m_getName;
  local_780 = EVar11.m_value;
  local_778.m_getName = local_788;
  local_778.m_value = local_780;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_778);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2b88b0c);
  EVar11 = glu::getTextureWrapModeStr(this->m_wrapT);
  local_7a8 = EVar11.m_getName;
  local_7a0 = EVar11.m_value;
  local_798.m_getName = local_7a8;
  local_798.m_value = local_7a0;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_798);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_768);
  tcu::TestLog::operator<<(&local_928,_height,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_928,(char (*) [9])"Filter: ");
  EVar11 = glu::getTextureFilterStr(this->m_minFilter);
  local_948 = EVar11.m_getName;
  local_940 = EVar11.m_value;
  local_938.m_getName = local_948;
  local_938.m_value = local_940;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_938);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2b88b0c);
  EVar11 = glu::getTextureFilterStr(this->m_magFilter);
  local_968 = EVar11.m_getName;
  local_960 = EVar11.m_value;
  local_958.m_getName = local_968;
  local_958.m_value = local_960;
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_958);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_928);
  tcu::TestLog::operator<<(&local_ae8,_height,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_ae8,(char (*) [10])"Mipmaps: ");
  local_af0 = "false";
  if ((p00.m_data[0]._3_1_ & 1) != 0) {
    local_af0 = "true";
  }
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_af0);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_ae8);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&fragSrc.field_0x170,_height,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&fragSrc.field_0x170,
                      (char (*) [25])"Using additive blending.");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&fragSrc.field_0x170);
  deqp::gls::ShaderPerformanceCase::setViewportSize
            (&this->super_ShaderPerformanceCase,iStack_1c,(int)p00.m_data[1]);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderPerformanceCase).m_vertShaderSource,
             "attribute highp vec4 a_position;\nattribute mediump vec2 a_coords;\nvarying mediump vec2 v_coords;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coords = a_coords;\n}\n"
            );
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&texNdx_1);
  std::operator<<((ostream *)&texNdx_1,"varying mediump vec2 v_coords;\n");
  for (local_dec = 0; local_dec < this->m_numTextures; local_dec = local_dec + 1) {
    poVar7 = std::operator<<((ostream *)&texNdx_1,"uniform sampler2D u_sampler");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_dec);
    std::operator<<(poVar7,";\n");
  }
  poVar7 = std::operator<<((ostream *)&texNdx_1,"void main (void)\n");
  std::operator<<(poVar7,"{\n");
  for (local_df0 = 0; local_df0 < this->m_numTextures; local_df0 = local_df0 + 1) {
    poVar7 = std::operator<<((ostream *)&texNdx_1,"\t");
    pcVar10 = "r += ";
    if (local_df0 == 0) {
      pcVar10 = "lowp vec4 r = ";
    }
    poVar7 = std::operator<<(poVar7,pcVar10);
    poVar7 = std::operator<<(poVar7,"texture2D(u_sampler");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_df0);
    std::operator<<(poVar7,", v_coords);\n");
  }
  poVar7 = std::operator<<((ostream *)&texNdx_1,"\tgl_FragColor = r;\n");
  std::operator<<(poVar7,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderPerformanceCase).m_fragShaderSource,local_e10);
  std::__cxx11::string::~string(local_e10);
  ctx_00 = (EVP_PKEY_CTX *)(long)this->m_numTextures;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve
            (&this->m_textures,(size_type)ctx_00);
  for (sw._4_4_ = 0; sw._4_4_ < this->m_numTextures; sw._4_4_ = sw._4_4_ + 1) {
    if ((init()::swizzles == '\0') && (iVar4 = __cxa_guard_acquire(&init()::swizzles), iVar4 != 0))
    {
      tcu::Vector<int,_4>::Vector(init::swizzles,0,1,2,3);
      tcu::Vector<int,_4>::Vector(init::swizzles + 1,1,2,3,0);
      tcu::Vector<int,_4>::Vector(init::swizzles + 2,2,3,0,1);
      tcu::Vector<int,_4>::Vector(init::swizzles + 3,3,0,1,2);
      tcu::Vector<int,_4>::Vector(init::swizzles + 4,3,2,1,0);
      tcu::Vector<int,_4>::Vector(init::swizzles + 5,2,1,0,3);
      tcu::Vector<int,_4>::Vector(init::swizzles + 6,1,0,3,2);
      tcu::Vector<int,_4>::Vector(init::swizzles + 7,0,3,2,1);
      __cxa_guard_release(&init()::swizzles);
    }
    texture = (Texture2D *)(init::swizzles + sw._4_4_ % 8);
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D
              (this_00,(this->super_ShaderPerformanceCase).m_renderCtx,this->m_format,
               this->m_dataType,iStack_1c,(int)p00.m_data[1]);
    ctx_00 = (EVP_PKEY_CTX *)&levelNdx;
    _levelNdx = this_00;
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::push_back
              (&this->m_textures,(value_type *)ctx_00);
    if ((p00.m_data[0]._3_1_ & 1) == 0) {
      local_1110 = 1;
    }
    else {
      pTVar8 = glu::Texture2D::getRefTexture(_levelNdx);
      local_1110 = tcu::TextureLevelPyramid::getNumLevels(&pTVar8->super_TextureLevelPyramid);
    }
    local_e2c = local_1110;
    for (local_e30 = 0; local_e30 < local_e2c; local_e30 = local_e30 + 1) {
      pTVar8 = glu::Texture2D::getRefTexture(_levelNdx);
      tcu::Texture2D::allocLevel(pTVar8,local_e30);
      pTVar8 = glu::Texture2D::getRefTexture(_levelNdx);
      access = tcu::TextureLevelPyramid::getLevel(&pTVar8->super_TextureLevelPyramid,local_e30);
      tcu::Vector<float,_4>::Vector(&local_e50,0.0,0.0,0.0,0.0);
      piVar9 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)texture,0);
      iVar4 = *piVar9;
      piVar9 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)texture,1);
      iVar2 = *piVar9;
      piVar9 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)texture,2);
      iVar3 = *piVar9;
      tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)texture,3);
      tcu::Vector<float,_4>::swizzle(&local_e40,(int)&local_e50,iVar4,iVar2,iVar3);
      tcu::Vector<float,_4>::Vector(&local_e70,1.0,1.0,1.0,1.0);
      piVar9 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)texture,0);
      iVar4 = *piVar9;
      piVar9 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)texture,1);
      iVar2 = *piVar9;
      piVar9 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)texture,2);
      iVar3 = *piVar9;
      tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)texture,3);
      tcu::Vector<float,_4>::swizzle(&local_e60,(int)&local_e70,iVar4,iVar2,iVar3);
      ctx_00 = (EVP_PKEY_CTX *)&local_e40;
      tcu::fillWithComponentGradients(access,(Vec4 *)ctx_00,&local_e60);
    }
    (*_levelNdx->_vptr_Texture2D[2])();
  }
  deqp::gls::ShaderPerformanceCase::init(&this->super_ShaderPerformanceCase,ctx_00);
  iVar4 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&texNdx_1);
  return iVar4;
}

Assistant:

void Texture2DRenderCase::init (void)
{
	TestLog& log = m_testCtx.getLog();

	int width	= m_renderCtx.getRenderTarget().getWidth();
	int height	= m_renderCtx.getRenderTarget().getHeight();

	if (m_powerOfTwo)
	{
		width	= roundDownToPowerOfTwo(width);
		height	= roundDownToPowerOfTwo(height);
	}

	bool mipmaps = m_minFilter == GL_NEAREST_MIPMAP_NEAREST ||
				   m_minFilter == GL_NEAREST_MIPMAP_LINEAR	||
				   m_minFilter == GL_LINEAR_MIPMAP_NEAREST	||
				   m_minFilter == GL_LINEAR_MIPMAP_LINEAR;

	DE_ASSERT(m_powerOfTwo || (!mipmaps && m_wrapS == GL_CLAMP_TO_EDGE && m_wrapT == GL_CLAMP_TO_EDGE));

	Vec2 p00 = (m_coordTransform * Vec3(0.0f, 0.0f, 1.0f)).swizzle(0,1);
	Vec2 p10 = (m_coordTransform * Vec3(1.0f, 0.0f, 1.0f)).swizzle(0,1);
	Vec2 p01 = (m_coordTransform * Vec3(0.0f, 1.0f, 1.0f)).swizzle(0,1);
	Vec2 p11 = (m_coordTransform * Vec3(1.0f, 1.0f, 1.0f)).swizzle(0,1);

	m_attributes.push_back(AttribSpec("a_coords", Vec4(p00.x(), p00.y(), 0.0f, 0.0f),
												  Vec4(p10.x(), p10.y(), 0.0f, 0.0f),
												  Vec4(p01.x(), p01.y(), 0.0f, 0.0f),
												  Vec4(p11.x(), p11.y(), 0.0f, 0.0f)));

	log << TestLog::Message << "Size: " << width << "x" << height << TestLog::EndMessage;
	log << TestLog::Message << "Format: " <<glu::getTextureFormatName(m_format) << " " << glu::getTypeName(m_dataType) << TestLog::EndMessage;
	log << TestLog::Message << "Coords: " << p00 << ", " << p10 << ", " << p01 << ", " << p11 << TestLog::EndMessage;
	log << TestLog::Message << "Wrap: " << glu::getTextureWrapModeStr(m_wrapS) << " / " << glu::getTextureWrapModeStr(m_wrapT) << TestLog::EndMessage;
	log << TestLog::Message << "Filter: " << glu::getTextureFilterStr(m_minFilter) << " / " << glu::getTextureFilterStr(m_magFilter) << TestLog::EndMessage;
	log << TestLog::Message << "Mipmaps: " << (mipmaps ? "true" : "false") << TestLog::EndMessage;
	log << TestLog::Message << "Using additive blending." << TestLog::EndMessage;

	// Use same viewport size as texture size.
	setViewportSize(width, height);

	m_vertShaderSource =
		"attribute highp vec4 a_position;\n"
		"attribute mediump vec2 a_coords;\n"
		"varying mediump vec2 v_coords;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_coords = a_coords;\n"
		"}\n";

	std::ostringstream fragSrc;
	fragSrc << "varying mediump vec2 v_coords;\n";

	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
		fragSrc << "uniform sampler2D u_sampler" << texNdx << ";\n";

	fragSrc << "void main (void)\n"
			<< "{\n";

	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
		fragSrc << "\t" << (texNdx == 0 ? "lowp vec4 r = " : "r += ") << "texture2D(u_sampler" << texNdx << ", v_coords);\n";

	fragSrc << "	gl_FragColor = r;\n"
			<< "}\n";

	m_fragShaderSource = fragSrc.str();

	m_textures.reserve(m_numTextures);
	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
	{
		static const IVec4 swizzles[] = { IVec4(0,1,2,3), IVec4(1,2,3,0), IVec4(2,3,0,1), IVec4(3,0,1,2),
										  IVec4(3,2,1,0), IVec4(2,1,0,3), IVec4(1,0,3,2), IVec4(0,3,2,1) };
		const IVec4& sw = swizzles[texNdx % DE_LENGTH_OF_ARRAY(swizzles)];

		glu::Texture2D* texture = new glu::Texture2D(m_renderCtx, m_format, m_dataType, width, height);
		m_textures.push_back(texture);

		// Fill levels.
		int numLevels = mipmaps ? texture->getRefTexture().getNumLevels() : 1;
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			texture->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(texture->getRefTexture().getLevel(levelNdx),
											Vec4(0.0f, 0.0f, 0.0f, 0.0f).swizzle(sw[0], sw[1], sw[2], sw[3]),
											Vec4(1.0f, 1.0f, 1.0f, 1.0f).swizzle(sw[0], sw[1], sw[2], sw[3]));
		}

		texture->upload();
	}

	ShaderPerformanceCase::init();
}